

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

void Amulet_on(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  if (uamul != (obj *)0x0) {
    Oprops_on(uamul,0x10000);
    switch(uamul->otyp) {
    case 0xcb:
      discover_object(0xcb,'\x01','\x01');
      pline("It constricts your throat!");
      u.uprops[0x22].intrinsic = 6;
      break;
    case 0xcc:
      u.uprops[0x1f].intrinsic = rnd(100);
      break;
    case 0xce:
      iVar1 = poly_gender();
      if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
        change_sex();
        iVar2 = poly_gender();
        if (iVar1 == iVar2) {
          pline("You don\'t feel like yourself.");
        }
        else {
          discover_object(0xce,'\x01','\x01');
          pcVar3 = "feminine";
          if (flags.female == '\0') {
            pcVar3 = "masculine";
          }
          pline("You are suddenly very %s!",pcVar3);
          iflags.botl = '\x01';
        }
        pline("The amulet disintegrates!");
        iVar2 = poly_gender();
        if ((((iVar1 == iVar2) && ((uamul->field_0x4a & 0x20) != 0)) &&
            ((objects[0xce].field_0x10 & 1) == 0)) && (objects[0xce].oc_uname == (char *)0x0)) {
          docall(uamul);
        }
        useup(uamul);
      }
      break;
    case 0xcf:
      if (u.uprops[0x3a].intrinsic != 0) {
        u.uprops[0x3a].intrinsic = 0;
        iflags.botl = '\x01';
      }
    }
    discover_cursed_equip(uamul);
    on_msg(uamul,'\x01');
    return;
  }
  return;
}

Assistant:

static void Amulet_on(void)
{
    if (!uamul) return;

    Oprops_on(uamul, W_AMUL);

    switch(uamul->otyp) {
	case AMULET_OF_ESP:
	case AMULET_OF_LIFE_SAVING:
	case AMULET_VERSUS_POISON:
	case AMULET_OF_REFLECTION:
	case AMULET_OF_MAGICAL_BREATHING:
	case FAKE_AMULET_OF_YENDOR:
		break;
	case AMULET_OF_UNCHANGING:
		if (Slimed) {
		    Slimed = 0;
		    iflags.botl = 1;
		}
		break;
	case AMULET_OF_CHANGE:
	    {
		int orig_sex = poly_gender();

		if (Unchanging) break;
		change_sex();
		/* Don't use same message as polymorph */
		if (orig_sex != poly_gender()) {
		    makeknown(AMULET_OF_CHANGE);
		    pline("You are suddenly very %s!", flags.female ? "feminine"
			: "masculine");
		    iflags.botl = 1;
		} else
		    /* already polymorphed into single-gender monster; only
		       changed the character's base sex */
		    pline("You don't feel like yourself.");
		pline("The amulet disintegrates!");
		if (orig_sex == poly_gender() && uamul->dknown &&
			!objects[AMULET_OF_CHANGE].oc_name_known &&
			!objects[AMULET_OF_CHANGE].oc_uname)
		    docall(uamul);
		useup(uamul);
		break;
	    }
	case AMULET_OF_STRANGULATION:
		makeknown(AMULET_OF_STRANGULATION);
		pline("It constricts your throat!");
		Strangled = 6;
		break;
	case AMULET_OF_RESTFUL_SLEEP:
		HSleeping = rnd(100);
		break;
	case AMULET_OF_YENDOR:
		break;
    }

    /* AMULET_OF_CHANGE will null uamul via useup() */
    discover_cursed_equip(uamul);
    on_msg(uamul, TRUE);
}